

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_stringbuilder.cpp
# Opt level: O2

ssize_t __thiscall
icu_63::number::impl::NumberStringBuilder::splice
          (NumberStringBuilder *this,int __fdin,__off64_t *__offin,int __fdout,__off64_t *__offout,
          size_t __len,uint __flags)

{
  char16_t cVar1;
  uint count;
  int iVar2;
  ValueOrHeapArray<UNumberFormatFields> *pVVar3;
  undefined4 in_register_0000000c;
  ValueOrHeapArray<char16_t> *pVVar4;
  ulong uVar5;
  uint uVar6;
  undefined4 in_register_00000034;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  UErrorCode *in_stack_00000010;
  
  uVar5 = (ulong)__offout & 0xffffffff;
  uVar6 = (int)__len - (int)__offout;
  count = (__fdin - (int)__offin) + uVar6;
  if ((int)count < 1) {
    iVar2 = remove(this,(char *)CONCAT44(in_register_00000034,__fdin));
  }
  else {
    iVar2 = prepareForInsert(this,__fdin,count,in_stack_00000010);
  }
  if (*in_stack_00000010 < U_ILLEGAL_ARGUMENT_ERROR) {
    lVar7 = (long)iVar2;
    uVar8 = 0;
    if (0 < (int)uVar6) {
      uVar8 = (ulong)uVar6;
    }
    while (bVar9 = uVar8 != 0, uVar8 = uVar8 - 1, bVar9) {
      cVar1 = UnicodeString::doCharAt
                        ((UnicodeString *)CONCAT44(in_register_0000000c,__fdout),(int)uVar5);
      bVar9 = this->fUsingHeap == false;
      pVVar4 = (ValueOrHeapArray<char16_t> *)(this->fChars).heap.ptr;
      if (bVar9) {
        pVVar4 = &this->fChars;
      }
      pVVar4->value[lVar7] = cVar1;
      pVVar3 = (ValueOrHeapArray<UNumberFormatFields> *)(this->fFields).heap.ptr;
      if (bVar9) {
        pVVar3 = &this->fFields;
      }
      pVVar3->value[lVar7] = __flags;
      uVar5 = (ulong)((int)uVar5 + 1);
      lVar7 = lVar7 + 1;
    }
  }
  return (ulong)count;
}

Assistant:

int32_t
NumberStringBuilder::splice(int32_t startThis, int32_t endThis,  const UnicodeString &unistr,
                            int32_t startOther, int32_t endOther, Field field, UErrorCode& status) {
    int32_t thisLength = endThis - startThis;
    int32_t otherLength = endOther - startOther;
    int32_t count = otherLength - thisLength;
    int32_t position;
    if (count > 0) {
        // Overall, chars need to be added.
        position = prepareForInsert(startThis, count, status);
    } else {
        // Overall, chars need to be removed or kept the same.
        position = remove(startThis, -count);
    }
    if (U_FAILURE(status)) {
        return count;
    }
    for (int32_t i = 0; i < otherLength; i++) {
        getCharPtr()[position + i] = unistr.charAt(startOther + i);
        getFieldPtr()[position + i] = field;
    }
    return count;
}